

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitLoop(PrintSExpression *this,Loop *curr)

{
  ostream *o;
  bool bVar1;
  ostream *this_00;
  Name name;
  Loop *curr_local;
  PrintSExpression *this_local;
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  std::operator<<(this->o,'(');
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  maybePrintImplicitBlock(this,curr->body);
  decIndent(this);
  if ((this->full & 1U) != 0) {
    std::operator<<(this->o," ;; end loop");
    bVar1 = IString::is(&(curr->name).super_IString);
    if (bVar1) {
      this_00 = std::operator<<(this->o,' ');
      o = (ostream *)(curr->name).super_IString.str._M_len;
      name.super_IString.str._M_str = (char *)o;
      name.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
      wasm::operator<<((wasm *)this_00,o,name);
    }
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  return;
}

Assistant:

void PrintSExpression::visitLoop(Loop* curr) {
  controlFlowDepth++;
  o << '(';
  printExpressionContents(curr);
  incIndent();
  maybePrintImplicitBlock(curr->body);
  decIndent();
  if (full) {
    o << " ;; end loop";
    if (curr->name.is()) {
      o << ' ' << curr->name;
    }
  }
  controlFlowDepth--;
}